

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

int Acb_NtkExtract(char *pFileName0,char *pFileName1,int fVerbose,Gia_Man_t **ppGiaF,
                  Gia_Man_t **ppGiaG,Vec_Int_t **pvNodes,Vec_Ptr_t **pvNodesR)

{
  int iVar1;
  int iVar2;
  Acb_Ntk_t *p;
  Acb_Ntk_t *p_00;
  Gia_Man_t *pGia;
  Gia_Man_t *pGVar3;
  Vec_Int_t *pVVar4;
  Gia_Man_t *pGiaG;
  Gia_Man_t *pGiaF;
  int RetValue;
  Acb_Ntk_t *pNtkG;
  Acb_Ntk_t *pNtkF;
  Vec_Int_t **pvNodes_local;
  Gia_Man_t **ppGiaG_local;
  Gia_Man_t **ppGiaF_local;
  int fVerbose_local;
  char *pFileName1_local;
  char *pFileName0_local;
  
  p = Acb_VerilogSimpleRead(pFileName0,(char *)0x0);
  p_00 = Acb_VerilogSimpleRead(pFileName1,(char *)0x0);
  pGiaF._4_4_ = 0;
  if ((p != (Acb_Ntk_t *)0x0) && (p_00 != (Acb_Ntk_t *)0x0)) {
    pGia = Acb_NtkToGia2(p);
    pGVar3 = Acb_NtkToGia2(p_00);
    iVar1 = Acb_NtkCiNum(p);
    iVar2 = Acb_NtkCiNum(p_00);
    if (iVar1 != iVar2) {
      __assert_fail("Acb_NtkCiNum(pNtkF) == Acb_NtkCiNum(pNtkG)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                    ,0x288,
                    "int Acb_NtkExtract(char *, char *, int, Gia_Man_t **, Gia_Man_t **, Vec_Int_t **, Vec_Ptr_t **)"
                   );
    }
    iVar1 = Acb_NtkCoNum(p);
    iVar2 = Acb_NtkCoNum(p_00);
    if (iVar1 != iVar2) {
      __assert_fail("Acb_NtkCoNum(pNtkF) == Acb_NtkCoNum(pNtkG)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                    ,0x289,
                    "int Acb_NtkExtract(char *, char *, int, Gia_Man_t **, Gia_Man_t **, Vec_Int_t **, Vec_Ptr_t **)"
                   );
    }
    *ppGiaF = pGia;
    *ppGiaG = pGVar3;
    pVVar4 = Acb_NtkCollectCopies(p,pGia,pvNodesR);
    *pvNodes = pVVar4;
    pGiaF._4_4_ = 1;
  }
  if (p != (Acb_Ntk_t *)0x0) {
    Acb_ManFree(p->pDesign);
  }
  if (p_00 != (Acb_Ntk_t *)0x0) {
    Acb_ManFree(p_00->pDesign);
  }
  return pGiaF._4_4_;
}

Assistant:

int Acb_NtkExtract( char * pFileName0, char * pFileName1, int fVerbose, 
                    Gia_Man_t ** ppGiaF, Gia_Man_t ** ppGiaG, Vec_Int_t ** pvNodes, Vec_Ptr_t ** pvNodesR )
{
    extern Acb_Ntk_t * Acb_VerilogSimpleRead( char * pFileName, char * pFileNameW );
    Acb_Ntk_t * pNtkF = Acb_VerilogSimpleRead( pFileName0, NULL );
    Acb_Ntk_t * pNtkG = Acb_VerilogSimpleRead( pFileName1, NULL );
    int RetValue = 0;
    if ( pNtkF && pNtkG )
    {
        Gia_Man_t * pGiaF = Acb_NtkToGia2( pNtkF );
        Gia_Man_t * pGiaG = Acb_NtkToGia2( pNtkG );
        assert( Acb_NtkCiNum(pNtkF) == Acb_NtkCiNum(pNtkG) );
        assert( Acb_NtkCoNum(pNtkF) == Acb_NtkCoNum(pNtkG) );
        *ppGiaF  = pGiaF;
        *ppGiaG  = pGiaG;
        *pvNodes = Acb_NtkCollectCopies( pNtkF, pGiaF, pvNodesR );
        RetValue = 1;
    }
    if ( pNtkF ) Acb_ManFree( pNtkF->pDesign );
    if ( pNtkG ) Acb_ManFree( pNtkG->pDesign );
    return RetValue;
}